

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

EVstone INT_REVcreate_stone_action(CMConnection conn,char *action_spec)

{
  int iVar1;
  CManager cm;
  CMConnection in_RSI;
  CManager in_RDI;
  EVcreate_stone_action_request request;
  EV_int_response response;
  CMFormat f;
  int cond;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  EVstone in_stack_ffffffffffffffdc;
  CManager in_stack_ffffffffffffffe0;
  CMConnection p_Var2;
  int condition;
  
  memset(&stack0xffffffffffffffc8,0,0x10);
  iVar1 = INT_CMCondition_get(in_stack_ffffffffffffffe0,
                              (CMConnection)
                              CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  cm = (CManager)INT_CMlookup_format((CManager)in_RDI->transports,EVcreate_stone_action_req_formats)
  ;
  p_Var2 = in_RSI;
  if (cm == (CManager)0x0) {
    cm = (CManager)
         INT_CMregister_format
                   ((CManager)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (FMStructDescList)in_RSI);
  }
  condition = (int)((ulong)p_Var2 >> 0x20);
  INT_CMCondition_set_client_data(cm,in_stack_ffffffffffffffdc,in_RSI);
  INT_CMwrite(in_RSI,(CMFormat)CONCAT44(in_stack_ffffffffffffffcc,iVar1),(void *)0x1558a6);
  INT_CMCondition_wait(in_RDI,condition);
  return in_stack_ffffffffffffffdc;
}

Assistant:

extern EVstone
INT_REVcreate_stone_action(CMConnection conn, char *action_spec)
{
    int cond;
    CMFormat f;
    EV_int_response response;
    EVcreate_stone_action_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVcreate_stone_action_req_formats);
    request.action_spec = action_spec;
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVcreate_stone_action_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, &response);
    INT_CMwrite(conn, f, &request);
    INT_CMCondition_wait(conn->cm, cond);
    return (EVstone) response.ret;
}